

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::ClipperOffset::DoRound(ClipperOffset *this,int j,int k,MathKernel *math)

{
  pointer *ppIVar1;
  pointer pDVar2;
  pointer pIVar3;
  iterator iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  IntPoint local_58;
  double local_40;
  double local_38;
  double dStack_30;
  
  local_58.X = (cInt)this->m_sinA;
  pDVar2 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_40 = pDVar2[k].X * pDVar2[j].X + pDVar2[k].Y * pDVar2[j].Y;
  if ((math->atan2).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  dVar9 = (*(math->atan2)._M_invoker)((_Any_data *)&math->atan2,(double *)&local_58,&local_40);
  dVar9 = ABS(dVar9) * this->m_StepsPerRad;
  uVar5 = (ulong)(dVar9 + *(double *)(&DAT_00118070 + (ulong)(dVar9 < 0.0) * 8));
  pDVar2 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start + k;
  dVar9 = pDVar2->X;
  dVar12 = pDVar2->Y;
  uVar7 = 1;
  if (1 < (int)uVar5) {
    uVar7 = uVar5 & 0xffffffff;
  }
  do {
    pIVar3 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar10 = this->m_delta * dVar9 + (double)pIVar3[j].X;
    dVar11 = this->m_delta * dVar12 + (double)pIVar3[j].Y;
    uVar5 = -(ulong)(dVar10 < 0.0);
    uVar8 = -(ulong)(dVar11 < 0.0);
    local_58.X = (cInt)((double)(uVar5 & 0xbfe0000000000000 | ~uVar5 & 0x3fe0000000000000) + dVar10)
    ;
    local_58.Y = (cInt)((double)(uVar8 & 0xbfe0000000000000 | ~uVar8 & 0x3fe0000000000000) + dVar11)
    ;
    iVar4._M_current =
         (this->m_destPoly).
         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->m_destPoly).
        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_38 = dVar9;
      dStack_30 = dVar12;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
      _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,iVar4,&local_58);
      dVar10 = local_38;
      dVar12 = dStack_30;
    }
    else {
      (iVar4._M_current)->X = local_58.X;
      (iVar4._M_current)->Y = local_58.Y;
      ppIVar1 = &(this->m_destPoly).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
      dVar10 = dVar9;
    }
    dVar9 = dVar10 * this->m_cos + -this->m_sin * dVar12;
    dVar12 = dVar10 * this->m_sin + this->m_cos * dVar12;
    uVar6 = (int)uVar7 - 1;
    uVar7 = (ulong)uVar6;
  } while (uVar6 != 0);
  pIVar3 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar2 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start + j;
  dVar9 = this->m_delta * pDVar2->X + (double)pIVar3[j].X;
  dVar12 = this->m_delta * pDVar2->Y + (double)pIVar3[j].Y;
  uVar5 = -(ulong)(dVar9 < 0.0);
  uVar7 = -(ulong)(dVar12 < 0.0);
  local_58.X = (cInt)((double)(uVar5 & 0xbfe0000000000000 | ~uVar5 & 0x3fe0000000000000) + dVar9);
  local_58.Y = (cInt)((double)(uVar7 & 0xbfe0000000000000 | ~uVar7 & 0x3fe0000000000000) + dVar12);
  iVar4._M_current =
       (this->m_destPoly).
       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->m_destPoly).
      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    _M_realloc_insert<ClipperLib::IntPoint>(&this->m_destPoly,iVar4,&local_58);
  }
  else {
    (iVar4._M_current)->X = local_58.X;
    (iVar4._M_current)->Y = local_58.Y;
    ppIVar1 = &(this->m_destPoly).
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return;
}

Assistant:

void ClipperOffset::DoRound(int j, int k, const MathKernel& math)
{
  double a = math.atan2(m_sinA,
  m_normals[k].X * m_normals[j].X + m_normals[k].Y * m_normals[j].Y);
  int steps = std::max((int)Round(m_StepsPerRad * std::fabs(a)), 1);

  double X = m_normals[k].X, Y = m_normals[k].Y, X2;
  for (int i = 0; i < steps; ++i)
  {
    m_destPoly.push_back(IntPoint(
        Round(m_srcPoly[j].X + X * m_delta),
        Round(m_srcPoly[j].Y + Y * m_delta)));
    X2 = X;
    X = X * m_cos - m_sin * Y;
    Y = X2 * m_sin + Y * m_cos;
  }
  m_destPoly.push_back(IntPoint(
  Round(m_srcPoly[j].X + m_normals[j].X * m_delta),
  Round(m_srcPoly[j].Y + m_normals[j].Y * m_delta)));
}